

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

int Wlc_PrsRemoveComments(Wlc_Prs_t *p)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  Vec_Str_t *pVVar7;
  size_t sVar8;
  size_t sVar9;
  int level;
  byte *pbVar10;
  byte *pbVar11;
  char *pcVar12;
  byte *pbVar13;
  byte *__s1;
  bool bVar14;
  
  if ((long)p->nFileSize < 1) {
    return 1;
  }
  __s1 = (byte *)p->pBuffer;
  pbVar13 = __s1 + p->nFileSize;
  bVar3 = false;
LAB_00374287:
  pcVar12 = "Cannot find end-of-line after symbols \"`\".";
  bVar5 = *__s1;
  if (bVar5 < 0x65) {
    if (bVar5 == 0x2f) {
      if (__s1[1] == 0x2a) {
        sVar8 = 1;
        do {
          sVar9 = sVar8;
          if (__s1[sVar9] == 0) {
            pcVar12 = "Cannot find symbols \"*/\" after symbols \"/*\".";
            goto LAB_0037470f;
          }
          sVar8 = sVar9 + 1;
        } while ((__s1[sVar9] != 0x2f) || (__s1[sVar9 - 1] != 0x2a));
      }
      else {
        if (__s1[1] != 0x2f) goto LAB_00374467;
        if ((((__s1 + 5 < pbVar13) && (__s1[2] == 0x61)) && (__s1[3] == 0x62)) &&
           ((__s1[4] == 99 && (__s1[5] == 0x32)))) {
          __s1[4] = 0x20;
          __s1[5] = 0x20;
          __s1[0] = 0x20;
          __s1[1] = 0x20;
          __s1[2] = 0x20;
          __s1[3] = 0x20;
          goto LAB_0037447f;
        }
        iVar6 = strncmp((char *)(__s1 + 3),"Pair:",5);
        if (iVar6 == 0) {
          if (p->vPoPairs == (Vec_Str_t *)0x0) {
            pVVar7 = (Vec_Str_t *)malloc(0x10);
            pVVar7->nCap = 100;
            pVVar7->nSize = 0;
            pcVar12 = (char *)malloc(100);
            pVVar7->pArray = pcVar12;
            p->vPoPairs = pVVar7;
          }
          pbVar11 = __s1 + 9;
          do {
            bVar5 = *pbVar11;
            if (bVar5 != 0xd) {
              if (bVar5 == 0x20) {
                pVVar7 = p->vPoPairs;
                uVar1 = pVVar7->nSize;
                if (uVar1 == pVVar7->nCap) {
                  if ((int)uVar1 < 0x10) {
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar7->pArray,0x10);
                    }
                    pVVar7->pArray = pcVar12;
                    pVVar7->nCap = 0x10;
                  }
                  else {
                    sVar8 = (ulong)uVar1 * 2;
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar8);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar7->pArray,sVar8);
                    }
                    pVVar7->pArray = pcVar12;
                    pVVar7->nCap = (int)sVar8;
                  }
                }
                else {
                  pcVar12 = pVVar7->pArray;
                }
                bVar5 = 0;
              }
              else {
                if (bVar5 == 10) goto LAB_00374649;
                pVVar7 = p->vPoPairs;
                uVar1 = pVVar7->nSize;
                if (uVar1 == pVVar7->nCap) {
                  if ((int)uVar1 < 0x10) {
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar7->pArray,0x10);
                    }
                    pVVar7->pArray = pcVar12;
                    pVVar7->nCap = 0x10;
                  }
                  else {
                    sVar8 = (ulong)uVar1 * 2;
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar12 = (char *)malloc(sVar8);
                    }
                    else {
                      pcVar12 = (char *)realloc(pVVar7->pArray,sVar8);
                    }
                    pVVar7->pArray = pcVar12;
                    pVVar7->nCap = (int)sVar8;
                  }
                }
                else {
                  pcVar12 = pVVar7->pArray;
                }
              }
              iVar6 = pVVar7->nSize;
              pVVar7->nSize = iVar6 + 1;
              pcVar12[iVar6] = bVar5;
            }
            pbVar11 = pbVar11 + 1;
          } while( true );
        }
        bVar2 = true;
        bVar5 = 0x2f;
        sVar8 = 0;
        while ((bool)(~bVar2 & 1) || bVar5 != 10) {
          bVar14 = bVar5 != 0x5c;
          bVar4 = bVar5 == 0x20;
          if (!bVar14) {
            bVar4 = bVar14;
          }
          if (bVar2) {
            bVar4 = bVar14;
          }
          bVar2 = bVar4;
          bVar5 = __s1[sVar8 + 1];
          sVar8 = sVar8 + 1;
          if (bVar5 == 0) {
            pcVar12 = "Cannot find end-of-line after symbols \"//\".";
            goto LAB_0037470f;
          }
        }
      }
    }
    else {
      if (bVar5 != 0x60) goto LAB_0037446a;
      bVar2 = true;
      sVar8 = 0;
      bVar5 = 0x60;
      while ((bool)(~bVar2 & 1) || bVar5 != 10) {
        bVar14 = bVar5 != 0x5c;
        bVar4 = bVar5 == 0x20;
        if (!bVar14) {
          bVar4 = bVar14;
        }
        if (bVar2) {
          bVar4 = bVar14;
        }
        bVar2 = bVar4;
        bVar5 = __s1[sVar8 + 1];
        sVar8 = sVar8 + 1;
        if (bVar5 == 0) {
LAB_0037470f:
          Wlc_PrsWriteErrorMessage(p,(char *)__s1,pcVar12);
          return 0;
        }
      }
    }
    if (__s1 < __s1 + sVar8) {
      memset(__s1,0x20,sVar8);
      __s1 = __s1 + sVar8;
    }
    goto LAB_00374467;
  }
  if (bVar5 != 0x65) {
    if (bVar5 == 0x73) {
      if (__s1[1] == 0x70) {
        if ((__s1[2] == 0x65) &&
           (iVar6 = strncmp((char *)__s1,"specify",7), __s1 < pbVar13 + -10 && iVar6 == 0)) {
          sVar8 = 10;
          pbVar11 = __s1;
          do {
            if (((*pbVar11 == 0x65) && (pbVar11[1] == 0x6e)) && (pbVar11[2] == 100)) {
              pcVar12 = "endspecify";
              pbVar10 = pbVar11;
              iVar6 = strncmp((char *)pbVar11,"endspecify",10);
              level = (int)pbVar10;
              if (iVar6 == 0) {
                if (__s1 < pbVar11 + 10) {
                  pcVar12 = (char *)0x20;
                  memset(__s1,0x20,sVar8);
                  level = (int)__s1;
                  __s1 = pbVar11 + 10;
                }
                if (!bVar3) {
                  Abc_Print(level,pcVar12);
                }
                bVar3 = true;
                break;
              }
            }
            pbVar11 = pbVar11 + 1;
            sVar8 = sVar8 + 1;
          } while (pbVar11 < pbVar13 + -10);
        }
        goto LAB_00374467;
      }
      goto LAB_0037447f;
    }
    goto LAB_0037446a;
  }
  if (__s1[1] == 0x6e) {
    if ((__s1[2] == 100) && (iVar6 = strncmp((char *)__s1,"endmodule",9), iVar6 == 0)) {
      __s1[9] = 0x3b;
    }
    goto LAB_00374467;
  }
  goto LAB_0037447f;
LAB_00374649:
  pVVar7 = p->vPoPairs;
  uVar1 = pVVar7->nSize;
  if ((int)uVar1 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x197,"char Vec_StrEntryLast(Vec_Str_t *)");
  }
  pcVar12 = pVVar7->pArray;
  if (pcVar12[(ulong)uVar1 - 1] != '\0') {
    if (uVar1 == pVVar7->nCap) {
      if (uVar1 < 0x10) {
        pcVar12 = (char *)realloc(pcVar12,0x10);
        sVar8 = 0x10;
      }
      else {
        sVar8 = (ulong)uVar1 * 2;
        pcVar12 = (char *)realloc(pcVar12,sVar8);
      }
      pVVar7->pArray = pcVar12;
      pVVar7->nCap = (int)sVar8;
    }
    iVar6 = pVVar7->nSize;
    pVVar7->nSize = iVar6 + 1;
    pcVar12[iVar6] = '\0';
  }
LAB_00374467:
  bVar5 = *__s1;
LAB_0037446a:
  if ((bVar5 < 0xe) && ((0x2600U >> (bVar5 & 0x1f) & 1) != 0)) {
    *__s1 = 0x20;
  }
LAB_0037447f:
  __s1 = __s1 + 1;
  if (pbVar13 <= __s1) {
    return 1;
  }
  goto LAB_00374287;
}

Assistant:

int Wlc_PrsRemoveComments( Wlc_Prs_t * p )
{
    int fSpecifyFound = 0;
    char * pCur, * pNext, * pEnd = p->pBuffer + p->nFileSize;
    for ( pCur = p->pBuffer; pCur < pEnd; pCur++ )
    {
        // regular comment (//)
        if ( *pCur == '/' && pCur[1] == '/' )
        {
            if ( pCur + 5 < pEnd && pCur[2] == 'a' && pCur[3] == 'b' && pCur[4] == 'c' && pCur[5] == '2' )
                pCur[0] = pCur[1] = pCur[2] = pCur[3] = pCur[4] = pCur[5] = ' ';
            else if ( !strncmp(pCur + 3, "Pair:", 5) )
            {
                if ( p->vPoPairs == NULL )
                    p->vPoPairs = Vec_StrAlloc( 100 );
                for ( pNext = pCur + 9; *pNext != '\n'; pNext++ )
                {
                    if ( *pNext == ' ' )
                        Vec_StrPush( p->vPoPairs, '\0' );
                    else if ( *pNext != '\r' )
                        Vec_StrPush( p->vPoPairs, *pNext );
                }
                if ( Vec_StrEntryLast(p->vPoPairs) != 0 )
                    Vec_StrPush(p->vPoPairs, 0);
            }
            else
            {
                pNext = Wlc_PrsFindSymbol( pCur, '\n' );
                if ( pNext == NULL )
                    return Wlc_PrsWriteErrorMessage( p, pCur, "Cannot find end-of-line after symbols \"//\"." );
                for ( ; pCur < pNext; pCur++ )
                    *pCur = ' ';
            }
        }
        // skip preprocessor directive (`timescale, `celldefine, etc)
        else if ( *pCur == '`' )
        {
            pNext = Wlc_PrsFindSymbol( pCur, '\n' );
            if ( pNext == NULL )
                return Wlc_PrsWriteErrorMessage( p, pCur, "Cannot find end-of-line after symbols \"`\"." );
            for ( ; pCur < pNext; pCur++ )
                *pCur = ' ';
        }
        // regular comment (/* ... */)
        else if ( *pCur == '/' && pCur[1] == '*' )
        {
            pNext = Wlc_PrsFindSymbolTwo( pCur, '*', '/' );
            if ( pNext == NULL )
                return Wlc_PrsWriteErrorMessage( p, pCur, "Cannot find symbols \"*/\" after symbols \"/*\"." );
            // overwrite comment
            for ( ; pCur < pNext + 2; pCur++ )
                *pCur = ' ';
        }
        // 'specify' treated as comments
        else if ( *pCur == 's' && pCur[1] == 'p' && pCur[2] == 'e' && !strncmp(pCur, "specify", 7) )
        {
            for ( pNext = pCur; pNext < pEnd - 10; pNext++ )
                if ( *pNext == 'e' && pNext[1] == 'n' && pNext[2] == 'd' && !strncmp(pNext, "endspecify", 10) )
                {
                    // overwrite comment
                    for ( ; pCur < pNext + 10; pCur++ )
                        *pCur = ' ';
                    if ( fSpecifyFound == 0 )
                        Abc_Print( 0, "Ignoring specify/endspecify directives.\n" );
                    fSpecifyFound = 1;
                    break;
                }
        }
        // insert semicolons
        else if ( *pCur == 'e' && pCur[1] == 'n' && pCur[2] == 'd' && !strncmp(pCur, "endmodule", 9) )
            pCur[strlen("endmodule")] = ';';
        // overwrite end-of-lines with spaces (less checking to do later on)
        if ( *pCur == '\n' || *pCur == '\r'  || *pCur == '\t' )
            *pCur = ' ';
    }
    return 1;
}